

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# required_fields.c
# Opt level: O0

_Bool upb_util_HasUnsetRequired
                (upb_Message *msg,upb_MessageDef *m,upb_DefPool *ext_pool,
                upb_FieldPathEntry **fields)

{
  undefined8 *puVar1;
  undefined8 local_138;
  undefined1 local_130 [8];
  upb_FindContext ctx;
  upb_FieldPathEntry **fields_local;
  upb_DefPool *ext_pool_local;
  upb_MessageDef *m_local;
  upb_Message *msg_local;
  
  ctx.err[0].__saved_mask.__val[0xf]._0_1_ = 0;
  ctx.err[0].__saved_mask.__val[0xf]._1_1_ = fields != (upb_FieldPathEntry **)0x0;
  ctx.out_fields.cap = (size_t)ext_pool;
  ctx._256_8_ = fields;
  upb_FieldPathVector_Init((upb_FieldPathVector *)local_130);
  upb_FieldPathVector_Init((upb_FieldPathVector *)&ctx.stack.cap);
  upb_util_FindUnsetRequiredInternal((upb_FindContext *)local_130,msg,m);
  upb_gfree((void *)local_130);
  if ((((byte)ctx.err[0].__saved_mask.__val[0xf] & 1) != 0) && (ctx._256_8_ != 0)) {
    upb_FieldPathVector_Reserve
              ((upb_FindContext *)local_130,(upb_FieldPathVector *)&ctx.stack.cap,1);
    puVar1 = (undefined8 *)(ctx.stack.cap + (long)ctx.out_fields.path * 0x10);
    *puVar1 = 0;
    puVar1[1] = local_138;
    *(size_t *)ctx._256_8_ = ctx.stack.cap;
  }
  return (_Bool)((byte)ctx.err[0].__saved_mask.__val[0xf] & 1);
}

Assistant:

bool upb_util_HasUnsetRequired(const upb_Message* msg, const upb_MessageDef* m,
                               const upb_DefPool* ext_pool,
                               upb_FieldPathEntry** fields) {
  upb_FindContext ctx;
  ctx.has_unset_required = false;
  ctx.save_paths = fields != NULL;
  ctx.ext_pool = ext_pool;
  upb_FieldPathVector_Init(&ctx.stack);
  upb_FieldPathVector_Init(&ctx.out_fields);
  upb_util_FindUnsetRequiredInternal(&ctx, msg, m);
  upb_gfree(ctx.stack.path);

  if (ctx.has_unset_required && fields) {
    upb_FieldPathVector_Reserve(&ctx, &ctx.out_fields, 1);
    ctx.out_fields.path[ctx.out_fields.size] =
        (upb_FieldPathEntry){.field = NULL};
    *fields = ctx.out_fields.path;
  }

  return ctx.has_unset_required;
}